

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charset_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  char *pcVar1;
  long *plVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  
  pcVar1 = (state->cur_)._M_current;
  if (pcVar1 == (state->end_)._M_current) {
    state->found_partial_match_ = true;
  }
  else {
    plVar2 = *(long **)&(state->context_).traits_[0x21].
                        super_counted_base<boost::xpressive::detail::traits<char>_>;
    bVar3 = (**(code **)(*plVar2 + 0x20))(plVar2,(int)*pcVar1);
    bVar4 = std::bitset<256UL>::test((bitset<256UL> *)this,(ulong)bVar3);
    if (bVar4) {
      (state->cur_)._M_current = (state->cur_)._M_current + 1;
      iVar5 = (*(next->
                super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_matchable[2])(next,state);
      if ((char)iVar5 != '\0') {
        return true;
      }
      (state->cur_)._M_current = (state->cur_)._M_current + -1;
    }
  }
  return false;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            if(state.eos() || !this->charset_.test(*state.cur_, traits_cast<Traits>(state), icase_type()))
            {
                return false;
            }

            ++state.cur_;
            if(next.match(state))
            {
                return true;
            }

            --state.cur_;
            return false;
        }